

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty
          (FBXExportProperty *this,vector<double,_std::allocator<double>_> *va)

{
  size_type sVar1;
  uchar *puVar2;
  const_reference pvVar3;
  ulong local_40;
  size_t i;
  double *d;
  allocator<unsigned_char> local_19;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *va_local;
  FBXExportProperty *this_local;
  
  this->type = 'd';
  local_18 = va;
  va_local = (vector<double,_std::allocator<double>_> *)this;
  sVar1 = std::vector<double,_std::allocator<double>_>::size(va);
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,sVar1 << 3,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(local_18);
    if (sVar1 <= local_40) break;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,local_40);
    *(value_type *)(puVar2 + local_40 * 8) = *pvVar3;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::vector<double>& va)
: type('d')
, data(8 * va.size()) {
    double* d = reinterpret_cast<double*>(data.data());
    for (size_t i = 0; i < va.size(); ++i) {
        d[i] = va[i];
    }
}